

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

err_t fileWrite(size_t *written,void *buf,size_t count,file_t file)

{
  err_t eVar1;
  size_t sVar2;
  
  sVar2 = fwrite(buf,1,count,(FILE *)file);
  *written = sVar2;
  eVar1 = 0xce;
  if (sVar2 == count) {
    eVar1 = 0;
  }
  return eVar1;
}

Assistant:

err_t fileWrite(size_t* written, const void* buf, size_t count, file_t file)
{
	ASSERT(memIsValid(buf, count));
	ASSERT(fileIsValid(file));
	ASSERT(memIsValid(written, O_PER_S));
	*written = fwrite(buf, 1, count, file);
	if (*written != count)
		return ERR_FILE_WRITE;
	return ERR_OK;
}